

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O2

void __thiscall
lscpp::stdio_transporter::stdio_transporter(stdio_transporter *this,bool log_communication)

{
  char *pcVar1;
  undefined3 in_register_00000031;
  comm_logger local_28;
  
  if (CONCAT31(in_register_00000031,log_communication) == 0) {
    (this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
    super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
    super__Optional_payload_base<lscpp::comm_logger>._M_engaged = false;
  }
  else {
    local_28.msg_id_ = 0;
    local_28.file_open_ = false;
    local_28._9_7_ = 0;
    local_28.cur_file_ = (FILE *)0x0;
    (this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
    super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
    super__Optional_payload_base<lscpp::comm_logger>._M_payload._M_value.msg_id_ = 0;
    *(undefined8 *)
     ((long)&(this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
             super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
             super__Optional_payload_base<lscpp::comm_logger>._M_payload + 8) = 0;
    (this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
    super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
    super__Optional_payload_base<lscpp::comm_logger>._M_payload._M_value.cur_file_ = (FILE *)0x0;
    (this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
    super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
    super__Optional_payload_base<lscpp::comm_logger>._M_engaged = true;
    comm_logger::~comm_logger(&local_28);
  }
  this->size_ = 0x400;
  pcVar1 = (char *)operator_new__(0x400);
  (this->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = pcVar1;
  return;
}

Assistant:

stdio_transporter::stdio_transporter(bool log_communication)
    : comm_logger_{log_communication ? std::optional<comm_logger>{comm_logger{}}
                                     : std::nullopt} {}